

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O2

void __thiscall FTGATexture::MakeTexture(FTGATexture *this)

{
  ushort uVar1;
  byte bVar2;
  BYTE BVar3;
  BYTE *pBVar4;
  ushort *buffer;
  ushort *puVar5;
  byte *pbVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ushort *puVar13;
  int x;
  uint uVar14;
  int x_6;
  byte *pbVar15;
  char *pcVar16;
  long lVar17;
  BYTE a;
  BYTE b;
  BYTE g;
  BYTE r;
  WORD w;
  byte local_182;
  char local_181;
  byte local_180;
  short local_17f;
  short local_17d;
  byte local_17b;
  byte local_172;
  byte local_171;
  FWadLump lump;
  BYTE PaletteMap [256];
  
  FWadCollection::OpenLumpNum(&lump,&Wads,(this->super_FTexture).SourceLump);
  pBVar4 = (BYTE *)operator_new__((ulong)(this->super_FTexture).Height *
                                  (ulong)(this->super_FTexture).Width);
  this->Pixels = pBVar4;
  FWadLump::Read(&lump,&local_182,0x12);
  FWadLump::Seek(&lump,(ulong)local_182,1);
  if (local_181 != '\0') {
    memset(PaletteMap,0,0x100);
    for (lVar17 = (long)local_17f; (lVar17 < 0x100 && (lVar17 < (long)local_17d + (long)local_17f));
        lVar17 = lVar17 + 1) {
      if (local_17b - 0xf < 2) {
        (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&w,2);
        r = (char)w * '\b';
        g = (byte)(w >> 2) & 0xf8;
        b = (byte)(w >> 7) & 0xf8;
LAB_005aaaa2:
        a = 0xff;
LAB_005aaaa6:
        BVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)r,(uint)g,(uint)b);
      }
      else {
        if (local_17b == 0x18) {
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&b,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&g,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&r,1);
          goto LAB_005aaaa2;
        }
        if (local_17b == 0x20) {
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&b,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&g,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&r,1);
          (*lump.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])(&lump,&a,1);
          if ((local_171 & 0xf) != 8) goto LAB_005aaaa2;
          if (-1 < (char)a) {
            BVar3 = '\0';
            goto LAB_005aaad0;
          }
          goto LAB_005aaaa6;
        }
        BVar3 = '\0';
        a = '\0';
        b = '\0';
        g = '\0';
        r = '\0';
      }
LAB_005aaad0:
      PaletteMap[lVar17] = BVar3;
    }
  }
  bVar2 = local_172 >> 3;
  uVar12 = (ulong)((uint)(this->super_FTexture).Height * (uint)(this->super_FTexture).Width *
                  (uint)bVar2);
  buffer = (ushort *)operator_new__(uVar12);
  if (local_180 < 4) {
    FWadLump::Read(&lump,buffer,uVar12);
  }
  else {
    ReadCompressed(this,&lump.super_FileReader,(BYTE *)buffer,(uint)bVar2);
  }
  uVar14 = (uint)local_172;
  uVar9 = (uint)(local_172 >> 3);
  uVar12 = (ulong)uVar9;
  uVar1 = (this->super_FTexture).Width;
  uVar8 = (uint)uVar1;
  uVar10 = uVar1 * uVar9;
  puVar5 = buffer;
  if ((local_171 & 0x20) == 0) {
    uVar11 = (ulong)uVar10;
    uVar10 = -uVar10;
    puVar5 = (ushort *)((long)buffer + uVar11 * ((ulong)(this->super_FTexture).Height - 1));
  }
  local_180 = local_180 & 7;
  if (local_180 == 3) {
    if (local_172 == 8) {
      for (uVar11 = 0; uVar11 < (this->super_FTexture).Height; uVar11 = uVar11 + 1) {
        puVar13 = (ushort *)(uVar11 * (long)(int)uVar10 + (long)puVar5);
        for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
          this->Pixels[(ulong)((this->super_FTexture).Height * uVar9) + (uVar11 & 0xffffffff)] =
               FTexture::GrayMap[(byte)*puVar13];
          puVar13 = (ushort *)((long)puVar13 + uVar12);
          uVar8 = (uint)(this->super_FTexture).Width;
        }
      }
    }
    else if (uVar14 == 0x10) {
      pbVar6 = (byte *)((long)puVar5 + 1);
      for (uVar11 = 0; uVar11 < (this->super_FTexture).Height; uVar11 = uVar11 + 1) {
        pbVar15 = pbVar6;
        for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
          this->Pixels[(ulong)((this->super_FTexture).Height * uVar9) + (uVar11 & 0xffffffff)] =
               FTexture::GrayMap[*pbVar15];
          uVar8 = (uint)(this->super_FTexture).Width;
          pbVar15 = pbVar15 + uVar12;
        }
        pbVar6 = pbVar6 + (int)uVar10;
      }
    }
  }
  else if (local_180 == 2) {
    if (uVar14 - 0xf < 2) {
      for (uVar12 = 0; uVar12 < (this->super_FTexture).Height; uVar12 = uVar12 + 1) {
        puVar13 = puVar5;
        for (uVar14 = 0; uVar14 < uVar8; uVar14 = uVar14 + 1) {
          uVar1 = *puVar13;
          this->Pixels[(ulong)((this->super_FTexture).Height * uVar14) + (uVar12 & 0xffffffff)] =
               RGB32k.All[(ulong)(uVar1 & 0x1f) + (ulong)(uVar1 & 0x3e0) + (ulong)(uVar1 & 0x7c00)];
          uVar8 = (uint)(this->super_FTexture).Width;
          puVar13 = (ushort *)((long)puVar13 + (ulong)(uVar9 & 0xfffffffe));
        }
        puVar5 = (ushort *)((long)puVar5 + (long)(int)uVar10);
      }
    }
    else if (uVar14 == 0x20) {
      if ((local_171 & 0xf) == 8) {
        pcVar7 = (char *)((long)puVar5 + 3);
        for (uVar11 = 0; uVar11 < (this->super_FTexture).Height; uVar11 = uVar11 + 1) {
          pcVar16 = pcVar7;
          for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
            if (*pcVar16 < '\0') {
              BVar3 = RGB32k.All
                      [(ulong)((byte)pcVar16[-3] >> 3) +
                       (ulong)((byte)pcVar16[-2] & 0xfffffff8) * 4 +
                       (ulong)(((byte)pcVar16[-1] & 0xf8) << 7)];
            }
            else {
              BVar3 = '\0';
            }
            this->Pixels[(ulong)((this->super_FTexture).Height * uVar9) + (uVar11 & 0xffffffff)] =
                 BVar3;
            uVar8 = (uint)(this->super_FTexture).Width;
            pcVar16 = pcVar16 + uVar12;
          }
          pcVar7 = pcVar7 + (int)uVar10;
        }
      }
      else {
        puVar5 = puVar5 + 1;
        for (uVar11 = 0; uVar11 < (this->super_FTexture).Height; uVar11 = uVar11 + 1) {
          puVar13 = puVar5;
          for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
            this->Pixels[(ulong)((this->super_FTexture).Height * uVar9) + (uVar11 & 0xffffffff)] =
                 RGB32k.All
                 [(ulong)(byte)((byte)puVar13[-1] >> 3) +
                  (ulong)(*(byte *)((long)puVar13 + -1) & 0xfffffff8) * 4 +
                  (ulong)(((byte)*puVar13 & 0xf8) << 7)];
            uVar8 = (uint)(this->super_FTexture).Width;
            puVar13 = (ushort *)((long)puVar13 + uVar12);
          }
          puVar5 = (ushort *)((long)puVar5 + (long)(int)uVar10);
        }
      }
    }
    else if (uVar14 == 0x18) {
      puVar5 = puVar5 + 1;
      for (uVar11 = 0; uVar11 < (this->super_FTexture).Height; uVar11 = uVar11 + 1) {
        puVar13 = puVar5;
        for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
          this->Pixels[(ulong)((this->super_FTexture).Height * uVar9) + (uVar11 & 0xffffffff)] =
               RGB32k.All
               [(ulong)(byte)((byte)puVar13[-1] >> 3) +
                (ulong)(*(byte *)((long)puVar13 + -1) & 0xfffffff8) * 4 +
                (ulong)(((byte)*puVar13 & 0xf8) << 7)];
          uVar8 = (uint)(this->super_FTexture).Width;
          puVar13 = (ushort *)((long)puVar13 + uVar12);
        }
        puVar5 = (ushort *)((long)puVar5 + (long)(int)uVar10);
      }
    }
  }
  else if (local_180 == 1) {
    for (uVar11 = 0; uVar11 < (this->super_FTexture).Height; uVar11 = uVar11 + 1) {
      puVar13 = (ushort *)(uVar11 * (long)(int)uVar10 + (long)puVar5);
      for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
        this->Pixels[(ulong)((this->super_FTexture).Height * uVar9) + (uVar11 & 0xffffffff)] =
             PaletteMap[(byte)*puVar13];
        puVar13 = (ushort *)((long)puVar13 + uVar12);
        uVar8 = (uint)(this->super_FTexture).Width;
      }
    }
  }
  operator_delete__(buffer);
  FWadLump::~FWadLump(&lump);
  return;
}

Assistant:

void FTGATexture::MakeTexture ()
{
	BYTE PaletteMap[256];
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	TGAHeader hdr;
	WORD w;
	BYTE r,g,b,a;
	BYTE * buffer;

	Pixels = new BYTE[Width*Height];
	lump.Read(&hdr, sizeof(hdr));
	lump.Seek(hdr.id_len, SEEK_CUR);
	
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	hdr.cm_first = LittleShort(hdr.cm_first);
	hdr.cm_length = LittleShort(hdr.cm_length);

	if (hdr.has_cm)
	{
		memset(PaletteMap, 0, 256);
		for (int i = hdr.cm_first; i < hdr.cm_first + hdr.cm_length && i < 256; i++)
		{
			switch (hdr.cm_size)
			{
			case 15:
			case 16:
				lump >> w;
				r = (w & 0x001F) << 3;
				g = (w & 0x03E0) >> 2;
				b = (w & 0x7C00) >> 7;
				a = 255;
				break;
				
			case 24:
				lump >> b >> g >> r;
				a=255;
				break;
				
			case 32:
				lump >> b >> g >> r >> a;
				if ((hdr.img_desc&15)!=8) a=255;
				break;
				
			default:	// should never happen
				r=g=b=a=0;
				break;
			}
			PaletteMap[i] = a>=128? ColorMatcher.Pick(r, g, b) : 0;
		}
    }
    
    int Size = Width * Height * (hdr.bpp>>3);
   	buffer = new BYTE[Size];
   	
    if (hdr.img_type < 4)	// uncompressed
    {
    	lump.Read(buffer, Size);
    }
    else				// compressed
    {
    	ReadCompressed(lump, buffer, hdr.bpp>>3);
    }
    
	BYTE * ptr = buffer;
	int step_x = (hdr.bpp>>3);
	int Pitch = Width * step_x;

	/*
	if (hdr.img_desc&32)
	{
		ptr += (Width-1) * step_x;
		step_x =- step_x;
	}
	*/
	if (!(hdr.img_desc&32))
	{
		ptr += (Height-1) * Pitch;
		Pitch = -Pitch;
	}

    switch (hdr.img_type & 7)
    {
	case 1:	// paletted
		for(int y=0;y<Height;y++)
		{
			BYTE * p = ptr + y * Pitch;
			for(int x=0;x<Width;x++)
			{
				Pixels[x*Height+y] = PaletteMap[*p];
				p+=step_x;
			}
		}
		break;

	case 2:	// RGB
		switch (hdr.bpp)
		{
		case 15:
		case 16:
			step_x>>=1;
			for(int y=0;y<Height;y++)
			{
				WORD * p = (WORD*)(ptr + y * Pitch);
				for(int x=0;x<Width;x++)
				{
					int v = LittleLong(*p);
					Pixels[x*Height+y] = RGB32k.RGB[(v>>10) & 0x1f][(v>>5) & 0x1f][v & 0x1f];
					p+=step_x;
				}
			}
			break;
		
		case 24:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
					p+=step_x;
				}
			}
			break;
		
		case 32:
			if ((hdr.img_desc&15)!=8)	// 32 bits without a valid alpha channel
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
						p+=step_x;
					}
				}
			}
			else
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = p[3] >= 128? RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3] : 0;
						p+=step_x;
					}
				}
			}
			break;
		
		default:
			break;
		}
		break;
	
	case 3:	// Grayscale
		switch (hdr.bpp)
		{
		case 8:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[*p];
					p+=step_x;
				}
			}
			break;
		
		case 16:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[p[1]];	// only use the high byte
					p+=step_x;
				}
			}
			break;
		
		default:
			break;
		}
		break;

	default:
		break;
    }
	delete [] buffer;
}